

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

void duckdb::ArgMinMaxBase<duckdb::LessThan,false>::
     Execute<double,int,duckdb::ArgMinMaxState<double,int>>
               (ArgMinMaxState<double,_int> *state,double x_data,int y_data,
               AggregateBinaryInput *binary)

{
  bool bVar1;
  
  bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                    (&binary->right_mask->super_TemplatedValidityMask<unsigned_long>,binary->ridx);
  if ((bVar1) && (y_data < state->value)) {
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (&binary->left_mask->super_TemplatedValidityMask<unsigned_long>,binary->lidx);
    (state->super_ArgMinMaxStateBase).arg_null = !bVar1;
    if (bVar1) {
      state->arg = x_data;
    }
    state->value = y_data;
  }
  return;
}

Assistant:

static void Execute(STATE &state, A_TYPE x_data, B_TYPE y_data, AggregateBinaryInput &binary) {
		if ((IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) && COMPARATOR::Operation(y_data, state.value)) {
			Assign(state, x_data, y_data, !binary.left_mask.RowIsValid(binary.lidx));
		}
	}